

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugXML.c
# Opt level: O2

void xmlShellPrintNode(xmlNodePtr node)

{
  FILE *__stream;
  
  __stream = _stdout;
  if (node != (xmlNodePtr)0x0) {
    if (node->type == XML_ATTRIBUTE_NODE) {
      xmlDebugDumpAttrList((FILE *)_stdout,(xmlAttrPtr)node,0);
    }
    else if (node->type == XML_DOCUMENT_NODE) {
      xmlDocDump((FILE *)_stdout,(xmlDocPtr)node);
    }
    else {
      xmlElemDump((FILE *)_stdout,node->doc,node);
    }
    fputc(10,__stream);
    return;
  }
  return;
}

Assistant:

static void
xmlShellPrintNodeCtxt(xmlShellCtxtPtr ctxt,xmlNodePtr node)
{
    FILE *fp;

    if (!node)
        return;
    if (ctxt == NULL)
	fp = stdout;
    else
	fp = ctxt->output;

    if (node->type == XML_DOCUMENT_NODE)
        xmlDocDump(fp, (xmlDocPtr) node);
    else if (node->type == XML_ATTRIBUTE_NODE)
        xmlDebugDumpAttrList(fp, (xmlAttrPtr) node, 0);
    else
        xmlElemDump(fp, node->doc, node);

    fprintf(fp, "\n");
}